

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlChar * xmlSAX2DecodeAttrEntities(xmlParserCtxtPtr ctxt,xmlChar *str,xmlChar *end)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *local_30;
  xmlChar *in;
  xmlChar *end_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_30 = str;
  do {
    if (end <= local_30) {
      return (xmlChar *)0x0;
    }
    xVar1 = *local_30;
    local_30 = local_30 + 1;
  } while (xVar1 != '&');
  pxVar2 = xmlExpandEntitiesInAttValue(ctxt,str,0);
  return pxVar2;
}

Assistant:

static xmlChar *
xmlSAX2DecodeAttrEntities(xmlParserCtxtPtr ctxt, const xmlChar *str,
                          const xmlChar *end) {
    const xmlChar *in;

    in = str;
    while (in < end)
        if (*in++ == '&')
	    goto decode;
    return(NULL);
decode:
    /*
     * If the value contains '&', we can be sure it was allocated and is
     * zero-terminated.
     */
    /* TODO: normalize if needed */
    return(xmlExpandEntitiesInAttValue(ctxt, str, /* normalize */ 0));
}